

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_sort(void)

{
  int iVar1;
  int iVar2;
  secp256k1_pubkey *pk_ptr [5];
  int j;
  size_t pk_order [5];
  int i;
  uchar pk_ser [5] [33];
  secp256k1_pubkey pk [5];
  void *in_stack_fffffffffffffda8;
  secp256k1_pubkey **in_stack_fffffffffffffdb0;
  secp256k1_context *in_stack_fffffffffffffdb8;
  size_t *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  size_t *in_stack_fffffffffffffdd8;
  secp256k1_pubkey *pk_00;
  int local_1fc;
  undefined1 local_1f8 [8];
  secp256k1_pubkey *in_stack_fffffffffffffe10;
  uchar *in_stack_fffffffffffffe18;
  secp256k1_pubkey *in_stack_fffffffffffffe20;
  secp256k1_context *in_stack_fffffffffffffe28;
  undefined1 local_148 [328];
  
  memcpy(local_1f8,&DAT_00173510,0xa5);
  memset(&stack0xfffffffffffffdd8,0,0x28);
  pk_00 = (secp256k1_pubkey *)0x1;
  local_1fc = 0;
  while( true ) {
    if (4 < local_1fc) {
      permute(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      test_sort_helper(pk_00,in_stack_fffffffffffffdd8,
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      permute(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      test_sort_helper(pk_00,in_stack_fffffffffffffdd8,
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      permute(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      test_sort_helper(pk_00,in_stack_fffffffffffffdd8,
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      for (local_1fc = 0; local_1fc < COUNT; local_1fc = local_1fc + 1) {
        permute(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
        test_sort_helper(pk_00,in_stack_fffffffffffffdd8,
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      }
      for (local_1fc = 0; local_1fc < COUNT; local_1fc = local_1fc + 1) {
        permute(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
        test_sort_helper(pk_00,in_stack_fffffffffffffdd8,
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      }
      local_1fc = 0;
      do {
        if (COUNT <= local_1fc) {
          return;
        }
        for (iVar1 = 0; iVar1 < 5; iVar1 = iVar1 + 1) {
          testutil_random_pubkey_test(in_stack_fffffffffffffe10);
          *(undefined1 **)(&stack0xfffffffffffffda8 + (long)iVar1 * 8) =
               local_148 + (long)iVar1 * 0x40;
        }
        secp256k1_ec_pubkey_sort
                  (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                   (size_t)in_stack_fffffffffffffda8);
        for (iVar1 = 1; iVar1 < 5; iVar1 = iVar1 + 1) {
          iVar2 = secp256k1_ec_pubkey_sort_cmp
                            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(void *)0x14da09);
          if (0 < iVar2) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                    ,0x1a16,
                    "test condition failed: secp256k1_ec_pubkey_sort_cmp(&pk_ptr[j - 1], &pk_ptr[j], CTX) <= 0"
                   );
            abort();
          }
        }
        local_1fc = local_1fc + 1;
      } while( true );
    }
    iVar1 = secp256k1_ec_pubkey_parse
                      (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
                       ,(size_t)in_stack_fffffffffffffe10);
    if (iVar1 == 0) break;
    local_1fc = local_1fc + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x19fb,
          "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pk[i], pk_ser[i], sizeof(pk_ser[i]))"
         );
  abort();
}

Assistant:

static void test_sort(void) {
    secp256k1_pubkey pk[5];
    unsigned char pk_ser[5][33] = {
        { 0x02, 0x08 },
        { 0x02, 0x0b },
        { 0x02, 0x0c },
        { 0x03, 0x05 },
        { 0x03, 0x0a },
    };
    int i;
    size_t pk_order[5] = { 0, 1, 2, 3, 4 };

    for (i = 0; i < 5; i++) {
        CHECK(secp256k1_ec_pubkey_parse(CTX, &pk[i], pk_ser[i], sizeof(pk_ser[i])));
    }

    permute(pk_order, 1);
    test_sort_helper(pk, pk_order, 1);
    permute(pk_order, 2);
    test_sort_helper(pk, pk_order, 2);
    permute(pk_order, 3);
    test_sort_helper(pk, pk_order, 3);
    for (i = 0; i < COUNT; i++) {
        permute(pk_order, 4);
        test_sort_helper(pk, pk_order, 4);
    }
    for (i = 0; i < COUNT; i++) {
        permute(pk_order, 5);
        test_sort_helper(pk, pk_order, 5);
    }
    /* Check that sorting also works for random pubkeys */
    for (i = 0; i < COUNT; i++) {
        int j;
        const secp256k1_pubkey *pk_ptr[5];
        for (j = 0; j < 5; j++) {
            testutil_random_pubkey_test(&pk[j]);
            pk_ptr[j] = &pk[j];
        }
        secp256k1_ec_pubkey_sort(CTX, pk_ptr, 5);
        for (j = 1; j < 5; j++) {
            CHECK(secp256k1_ec_pubkey_sort_cmp(&pk_ptr[j - 1], &pk_ptr[j], CTX) <= 0);
        }
    }
}